

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::AddArrayLink
          (UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL> *this)

{
  UnorderedArrayListLink *pUVar1;
  FunctionBodyResolveInfo *pFVar2;
  FunctionBodyResolveInfo *newBlockData;
  UnorderedArrayListLink *copiedOldBlock;
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL> *this_local;
  
  pUVar1 = SlabAllocatorBase<0>::
           SlabAllocateStruct<TTD::UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,2048ul>::UnorderedArrayListLink>
                     (this->m_alloc);
  pUVar1->CurrPos = (this->m_inlineHeadBlock).CurrPos;
  pUVar1->EndPos = (this->m_inlineHeadBlock).EndPos;
  pUVar1->BlockData = (this->m_inlineHeadBlock).BlockData;
  pUVar1->Next = (this->m_inlineHeadBlock).Next;
  pFVar2 = SlabAllocatorBase<0>::
           SlabAllocateFixedSizeArray<TTD::NSSnapValues::FunctionBodyResolveInfo,2048ul>
                     (this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = pFVar2;
  (this->m_inlineHeadBlock).CurrPos = pFVar2;
  (this->m_inlineHeadBlock).EndPos = pFVar2 + 0x800;
  (this->m_inlineHeadBlock).Next = pUVar1;
  return;
}

Assistant:

void AddArrayLink()
        {
            UnorderedArrayListLink* copiedOldBlock = this->m_alloc->template SlabAllocateStruct<UnorderedArrayListLink>();
            *copiedOldBlock = this->m_inlineHeadBlock;

            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = copiedOldBlock;
        }